

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O1

CharSetNode * __thiscall
UnifiedRegex::CharSetFull::ClearRange
          (CharSetFull *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  CharSetNode *pCVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar6;
  
  uVar6 = ~(-1 << ((char)level * '\x04' + 8U & 0x1f));
  if (uVar6 < h) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0xec,"(h <= lim(level))",
                       "The range for clearing provided is invalid for this level.");
    if (!bVar2) goto LAB_00e6cf5c;
    *puVar4 = 0;
  }
  if (h < l) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0xed,"(l <= h)","Can\'t clear where lower is bigger than the higher.");
    if (!bVar2) goto LAB_00e6cf5c;
    *puVar4 = 0;
  }
  if (uVar6 == h && l == 0) {
    pCVar5 = (CharSetNode *)0x0;
  }
  else {
    pCVar5 = CharSetNode::For(allocator,level);
    if (l != 0) {
      iVar3 = (*pCVar5->_vptr_CharSetNode[2])(pCVar5,allocator,(ulong)level,0,(ulong)(l - 1));
      if ((CharSetNode *)CONCAT44(extraout_var,iVar3) != pCVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0xf7,"(toReturn->Set(allocator, level, 0, l - 1) == toReturn)",
                           "toReturn->Set(allocator, level, 0, l - 1) == toReturn");
        if (!bVar2) goto LAB_00e6cf5c;
        *puVar4 = 0;
      }
    }
    if (h < uVar6) {
      iVar3 = (*pCVar5->_vptr_CharSetNode[2])
                        (pCVar5,allocator,(ulong)level,(ulong)(h + 1),(ulong)uVar6);
      if ((CharSetNode *)CONCAT44(extraout_var_00,iVar3) != pCVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0xfc,"(toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn)",
                           "toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn");
        if (!bVar2) {
LAB_00e6cf5c:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  return pCVar5;
}

Assistant:

CharSetNode* CharSetFull::ClearRange(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        AssertMsg(h <= lim(level), "The range for clearing provided is invalid for this level.");
        AssertMsg(l <= h, "Can't clear where lower is bigger than the higher.");
        if (l == 0 && h == lim(level))
        {
            return nullptr;
        }

        CharSetNode* toReturn = For(allocator, level);

        if (l > 0)
        {
            AssertVerify(toReturn->Set(allocator, level, 0, l - 1) == toReturn);
        }

        if (h < lim(level))
        {
            AssertVerify(toReturn->Set(allocator, level, h + 1, lim(level)) == toReturn);
        }

        return toReturn;
    }